

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_impl.h
# Opt level: O0

void __thiscall AddrInfo::AddrInfo(AddrInfo *this)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  *in_stack_ffffffffffffff78;
  CNetAddr *in_stack_ffffffffffffff80;
  CAddress *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CAddress::CAddress(in_stack_ffffffffffffff98);
  s<(char)48>();
  std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::time_point
            (in_stack_ffffffffffffff78,(duration *)0xefafb3);
  s<(char)48>();
  std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::time_point
            (in_stack_ffffffffffffff78,(duration *)0xefafe8);
  CNetAddr::CNetAddr(in_stack_ffffffffffffff80);
  s<(char)48>();
  std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::time_point
            (in_stack_ffffffffffffff78,(duration *)0xefb032);
  *(undefined4 *)(in_RDI + 0x70) = 0;
  *(undefined4 *)(in_RDI + 0x74) = 0;
  *(undefined1 *)(in_RDI + 0x78) = 0;
  *(undefined4 *)(in_RDI + 0x7c) = 0xffffffff;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

AddrInfo() : CAddress(), source()
    {
    }